

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Transmitter_PDU::SetModulationParameters(Transmitter_PDU *this,KOCTET *MP,KUINT8 Length)

{
  size_type sVar1;
  byte local_2c;
  value_type local_1d;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  KUINT8 i_1;
  KUINT8 ui8PaddingNeeded;
  KUINT8 i;
  KOCTET *pKStack_18;
  KUINT8 Length_local;
  KOCTET *MP_local;
  Transmitter_PDU *this_local;
  
  local_19 = Length;
  pKStack_18 = MP;
  MP_local = (KOCTET *)this;
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_vModulationParams);
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength -
       (short)sVar1;
  std::vector<char,_std::allocator<char>_>::clear(&this->m_vModulationParams);
  for (local_1a = 0; local_1a < local_19; local_1a = local_1a + 1) {
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vModulationParams,pKStack_18);
    pKStack_18 = pKStack_18 + 1;
  }
  if ((uint)local_19 % 8 == 0) {
    local_2c = 0;
  }
  else {
    local_2c = 8 - local_19 % 8;
  }
  local_1b = local_2c;
  for (local_1c = 0; local_1c < local_1b; local_1c = local_1c + 1) {
    local_1d = '\0';
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vModulationParams,&local_1d);
  }
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_vModulationParams);
  this->m_ui8LengthOfModulationParam = (KUINT8)sVar1;
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength +
       (ushort)this->m_ui8LengthOfModulationParam;
  return;
}

Assistant:

void Transmitter_PDU::SetModulationParameters( const KOCTET * MP, KUINT8 Length )
{
    // If we already have data clear it first.
    m_ui16PDULength -= m_vModulationParams.size();
    m_vModulationParams.clear();

    // Copy data into the vector
    for( KUINT8 i = 0; i < Length; ++i, ++MP )
    {
        m_vModulationParams.push_back( *MP );
    }

    // Check if we need to add any padding, the length should be a
    // multiple of 8.
    KUINT8 ui8PaddingNeeded = ( Length % 8 == 0 ? 0 : ( 8 - Length % 8 ) );

    // Add the padding, if needed.
    for( KUINT8 i = 0; i < ui8PaddingNeeded; ++ i )
    {
        m_vModulationParams.push_back( 0 );
    }

    // Update length
    m_ui8LengthOfModulationParam = m_vModulationParams.size();
    m_ui16PDULength += m_ui8LengthOfModulationParam;
}